

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O0

string * __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename_abi_cxx11_
          (string *__return_storage_ptr__,dwarf_resolver *this,die_object *cu_die,
          Dwarf_Unsigned file_i)

{
  dwarf_resolver *this_00;
  char **ppcVar1;
  source_location location;
  source_location location_00;
  bool bVar2;
  cache_mode cVar3;
  int iVar4;
  skeleton_info *psVar5;
  pointer ppVar6;
  char *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  unordered_map<unsigned_long_long,_std::pair<char_**,_long_long>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>_>
  *this_01;
  Dwarf_Signed dw_filecount_1;
  char **dw_srcfiles_1;
  pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_> local_f0;
  const_iterator local_d8;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
  local_d0;
  source_location local_c8;
  longlong *local_b8;
  char ***local_b0;
  Dwarf_Die local_a8;
  longlong local_a0;
  Dwarf_Signed dw_filecount_2;
  char **dw_srcfiles_2;
  _Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
  local_88;
  iterator it;
  Dwarf_Off off;
  long *local_68;
  char ***local_60;
  Dwarf_Die local_58;
  long local_50;
  Dwarf_Signed dw_filecount;
  char **dw_srcfiles;
  undefined1 local_29;
  Dwarf_Unsigned local_28;
  Dwarf_Unsigned file_i_local;
  die_object *cu_die_local;
  dwarf_resolver *this_local;
  string *filename;
  
  local_28 = file_i;
  file_i_local = (Dwarf_Unsigned)cu_die;
  cu_die_local = (die_object *)this;
  this_local = (dwarf_resolver *)__return_storage_ptr__;
  bVar2 = detail::optional::operator_cast_to_bool((optional *)&this->skeleton);
  if (bVar2) {
    psVar5 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(&this->skeleton);
    this_00 = psVar5->resolver;
    psVar5 = optional<cpptrace::detail::libdwarf::skeleton_info,_0>::unwrap(&this->skeleton);
    resolve_filename_abi_cxx11_(__return_storage_ptr__,this_00,&psVar5->cu_die,local_28);
  }
  else {
    local_29 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    cVar3 = get_cache_mode();
    if (cVar3 == prioritize_memory) {
      local_58 = die_object::get((die_object *)file_i_local);
      local_60 = (char ***)&dw_filecount;
      local_68 = &local_50;
      iVar4 = wrap<Dwarf_Die_s_*,_char_***,_long_long_*,_Dwarf_Error_s_**,_Dwarf_Die_s_*,_char_***,_long_long_*,_0>
                        (this,dwarf_srcfiles,&local_58,&local_60,&local_68);
      source_location::source_location
                ((source_location *)&off,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                 ,0x158);
      location._8_8_ = in_stack_fffffffffffffea0;
      location.file = in_stack_fffffffffffffe98;
      assert_impl<bool>((detail *)(ulong)(iVar4 == 0),true,0x33f994,
                        "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                        ,(char *)off,location);
      if ((long)local_28 < local_50) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,*(char **)(dw_filecount + local_28 * 8));
      }
      dwarf_dealloc(*(Dwarf_Debug *)file_i_local,(Dwarf_Ptr)dw_filecount,0xf);
    }
    else {
      it.
      super__Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                 )die_object::get_global_offset((die_object *)file_i_local);
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long_long,_std::pair<char_**,_long_long>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>_>
           ::find(&this->srcfiles_cache,(key_type *)&it);
      dw_srcfiles_2 =
           (char **)std::
                    unordered_map<unsigned_long_long,_std::pair<char_**,_long_long>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>_>
                    ::end(&this->srcfiles_cache);
      bVar2 = std::__detail::operator==
                        (&local_88,
                         (_Node_iterator_base<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false>
                          *)&dw_srcfiles_2);
      if (bVar2) {
        local_a8 = die_object::get((die_object *)file_i_local);
        local_b0 = (char ***)&dw_filecount_2;
        local_b8 = &local_a0;
        iVar4 = wrap<Dwarf_Die_s_*,_char_***,_long_long_*,_Dwarf_Error_s_**,_Dwarf_Die_s_*,_char_***,_long_long_*,_0>
                          (this,dwarf_srcfiles,&local_a8,&local_b0,&local_b8);
        source_location::source_location
                  (&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
                   ,0x164);
        location_00._8_8_ = in_stack_fffffffffffffea0;
        location_00.file = in_stack_fffffffffffffe98;
        assert_impl<bool>((detail *)(ulong)(iVar4 == 0),true,0x33f994,
                          "std::string cpptrace::detail::libdwarf::dwarf_resolver::resolve_filename(const die_object &, Dwarf_Unsigned)"
                          ,local_c8.file,location_00);
        this_01 = &this->srcfiles_cache;
        std::__detail::
        _Node_const_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>
        ::_Node_const_iterator
                  (&local_d8,
                   (_Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>
                    *)&local_88);
        std::pair<char_**,_long_long>::pair<char_**&,_long_long_&,_true>
                  ((pair<char_**,_long_long> *)&dw_srcfiles_1,(char ***)&dw_filecount_2,&local_a0);
        std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>::
        pair<unsigned_long_long_&,_true>
                  (&local_f0,(unsigned_long_long *)&it,(pair<char_**,_long_long> *)&dw_srcfiles_1);
        local_d0._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long_long,_std::pair<char_**,_long_long>,_std::hash<unsigned_long_long>,_std::equal_to<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>_>_>
             ::insert(this_01,local_d8,&local_f0);
        local_88._M_cur = local_d0._M_cur;
      }
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>
                             *)&local_88);
      ppcVar1 = (ppVar6->second).first;
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long_long,_std::pair<char_**,_long_long>_>,_false,_false>
                             *)&local_88);
      if ((long)local_28 < (ppVar6->second).second) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,ppcVar1[local_28]);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string resolve_filename(const die_object& cu_die, Dwarf_Unsigned file_i) {
            // for split-dwarf line resolution happens in the skeleton
            if(skeleton) {
                return skeleton.unwrap().resolver.resolve_filename(skeleton.unwrap().cu_die, file_i);
            }
            std::string filename;
            if(get_cache_mode() == cache_mode::prioritize_memory) {
                char** dw_srcfiles;
                Dwarf_Signed dw_filecount;
                VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
                dwarf_dealloc(cu_die.dbg, dw_srcfiles, DW_DLA_LIST);
            } else {
                auto off = cu_die.get_global_offset();
                auto it = srcfiles_cache.find(off);
                if(it == srcfiles_cache.end()) {
                    char** dw_srcfiles;
                    Dwarf_Signed dw_filecount;
                    VERIFY(wrap(dwarf_srcfiles, cu_die.get(), &dw_srcfiles, &dw_filecount) == DW_DLV_OK);
                    it = srcfiles_cache.insert(it, {off, {dw_srcfiles, dw_filecount}});
                }
                char** dw_srcfiles = it->second.first;
                Dwarf_Signed dw_filecount = it->second.second;
                if(Dwarf_Signed(file_i) < dw_filecount) {
                    // dwarf is using 1-indexing
                    filename = dw_srcfiles[file_i];
                }
            }
            return filename;
        }